

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_decompress4X_hufOnly_wksp_bmi2
                 (HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  U32 UVar1;
  size_t sVar2;
  
  if (dstSize == 0) {
    sVar2 = 0xffffffffffffffba;
  }
  else if (cSrcSize == 0) {
    sVar2 = 0xffffffffffffffec;
  }
  else {
    UVar1 = HUF_selectDecoder(dstSize,cSrcSize);
    if (UVar1 != 0) {
      sVar2 = HUF_decompress4X2_DCtx_wksp_bmi2
                        (dctx,dst,dstSize,cSrc,cSrcSize,workSpace,wkspSize,bmi2);
      return sVar2;
    }
    sVar2 = HUF_decompress4X1_DCtx_wksp_bmi2(dctx,dst,dstSize,cSrc,cSrcSize,workSpace,wkspSize,bmi2)
    ;
  }
  return sVar2;
}

Assistant:

size_t HUF_decompress4X_hufOnly_wksp_bmi2(HUF_DTable* dctx, void* dst, size_t dstSize, const void* cSrc, size_t cSrcSize, void* workSpace, size_t wkspSize, int bmi2)
{
    /* validation checks */
    if (dstSize == 0) return ERROR(dstSize_tooSmall);
    if (cSrcSize == 0) return ERROR(corruption_detected);

    {   U32 const algoNb = HUF_selectDecoder(dstSize, cSrcSize);
#if defined(HUF_FORCE_DECOMPRESS_X1)
        (void)algoNb;
        assert(algoNb == 0);
        return HUF_decompress4X1_DCtx_wksp_bmi2(dctx, dst, dstSize, cSrc, cSrcSize, workSpace, wkspSize, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
        (void)algoNb;
        assert(algoNb == 1);
        return HUF_decompress4X2_DCtx_wksp_bmi2(dctx, dst, dstSize, cSrc, cSrcSize, workSpace, wkspSize, bmi2);
#else
        return algoNb ? HUF_decompress4X2_DCtx_wksp_bmi2(dctx, dst, dstSize, cSrc, cSrcSize, workSpace, wkspSize, bmi2) :
                        HUF_decompress4X1_DCtx_wksp_bmi2(dctx, dst, dstSize, cSrc, cSrcSize, workSpace, wkspSize, bmi2);
#endif
    }
}